

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  allocator local_20a;
  allocator local_209;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"admin",(allocator *)&local_208);
  std::__cxx11::string::string((string *)&local_48,"test1",&local_20a);
  std::__cxx11::string::string((string *)&local_68,"1",&local_209);
  DirMan::CreatDir(&Dirs,&local_28,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_88,"test1",(allocator *)&local_208);
  std::__cxx11::string::string
            ((string *)&local_a8,"aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa",
             &local_20a);
  diskmanager::CreateFile(&A_Disk,&local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_c8,"admin",(allocator *)&local_208);
  std::__cxx11::string::string((string *)&local_e8,"test2",&local_20a);
  std::__cxx11::string::string((string *)&local_108,"1",&local_209);
  DirMan::CreatDir(&Dirs,&local_c8,&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)&local_128,"test2",(allocator *)&local_208);
  std::__cxx11::string::string((string *)&local_148,"dsfasdf",&local_20a);
  diskmanager::CreateFile(&A_Disk,&local_128,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  DirMan::ShowDirMan(&Dirs);
  poVar1 = std::operator<<((ostream *)&std::cout,"Data is ");
  std::__cxx11::string::string((string *)&local_168,"test1",&local_20a);
  diskmanager::ReadFile(&local_208,&A_Disk,&local_168);
  poVar1 = std::operator<<(poVar1,(string *)&local_208);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_168);
  poVar1 = std::operator<<((ostream *)&std::cout,"Data is ");
  std::__cxx11::string::string((string *)&local_188,"test2",&local_20a);
  diskmanager::ReadFile(&local_208,&A_Disk,&local_188);
  poVar1 = std::operator<<(poVar1,(string *)&local_208);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_188);
  poVar1 = std::operator<<((ostream *)&std::cout,"After Delete ");
  std::__cxx11::string::string((string *)&local_1a8,"test1",&local_20a);
  diskmanager::ReadFile(&local_208,&A_Disk,&local_1a8);
  poVar1 = std::operator<<(poVar1,(string *)&local_208);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1a8);
  poVar1 = std::operator<<((ostream *)&std::cout,"--------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&local_1c8,"test2",(allocator *)&local_208);
  Memory::Alloc(&Mems,3,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  Memory::show(&Mems);
  poVar1 = std::operator<<((ostream *)&std::cout,"--------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&local_1e8,"test1",(allocator *)&local_208);
  Memory::Alloc(&Mems,5,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  Memory::show(&Mems);
  return 0;
}

Assistant:

int main(){
  // 目录管理和磁盘管理测试
  Dirs.CreatDir("admin", "test1", "1");
  A_Disk.CreateFile("test1", "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa");
  Dirs.CreatDir("admin", "test2", "1");
  A_Disk.CreateFile("test2", "dsfasdf");
  Dirs.ShowDirMan();
  cout << "Data is " << A_Disk.ReadFile("test1") << endl;
  cout << "Data is " << A_Disk.ReadFile("test2") << endl;
//  Dirs.DelFile("test1");
  cout << "After Delete " << A_Disk.ReadFile("test1") << endl;

  //
  cout << "--------------" << endl;
  Mems.Alloc(3, "test2");
  Mems.show();
  cout << "--------------" << endl;
  Mems.Alloc(5, "test1");
  Mems.show();
  return 0;
}